

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

bool str::ends_with(string_view str,string_view content)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  uVar3 = content._M_len;
  uVar4 = str._M_len;
  if (uVar4 < uVar3) {
    bVar6 = false;
  }
  else if (uVar4 == 0) {
    bVar6 = true;
  }
  else {
    lVar5 = 0;
    do {
      bVar6 = -lVar5 == uVar3;
      if (bVar6) {
        return bVar6;
      }
      lVar2 = lVar5 + (uVar4 - 1);
      lVar1 = lVar5 + (uVar3 - 1);
      lVar5 = lVar5 + -1;
    } while (str._M_str[lVar2] == content._M_str[lVar1]);
  }
  return bVar6;
}

Assistant:

inline bool ends_with(std::string_view str, std::string_view content) {
        if (str.length() < content.length()) {
            return false;
        }

        if (str.empty()) {
            return content.empty();
        }

        for (auto str_it = str.rbegin(), content_it = content.rbegin(); content_it != content.rend(); str_it++, content_it++) {
            if (*str_it != *content_it) {
                return false;
            }
        }
        return true;
    }